

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_c.c
# Opt level: O0

int main(void)

{
  qpdflogger_handle local_40;
  qpdflogger_handle l;
  FILE *save2;
  FILE *save;
  FILE *error;
  FILE *warn;
  FILE *info;
  
  info._4_4_ = 0;
  warn = do_fopen("info");
  error = do_fopen("warn");
  save = do_fopen("error");
  save2 = do_fopen("save");
  l = (qpdflogger_handle)do_fopen("save2");
  local_40 = qpdflogger_default_logger();
  qpdflogger_set_info(local_40,qpdf_log_dest_custom,fn,warn);
  qpdflogger_set_warn(local_40,qpdf_log_dest_custom,fn,error);
  qpdflogger_set_error(local_40,qpdf_log_dest_custom,fn,save);
  qpdflogger_set_save(local_40,qpdf_log_dest_custom,fn,save2,0);
  do_run("{\"inputFile\": \"normal.pdf\", \"showNpages\": \"\"}",0);
  do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}",3);
  do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}",2);
  do_run("{\"inputFile\": \"normal.pdf\", \"staticId\": \"\", \"streamData\": \"uncompress\", \"outputFile\": \"-\"}"
         ,0);
  fclose((FILE *)warn);
  fclose((FILE *)error);
  fclose((FILE *)save);
  fclose((FILE *)save2);
  qpdflogger_set_info(local_40,qpdf_log_dest_stderr,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_warn(local_40,qpdf_log_dest_stdout,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_error(local_40,qpdf_log_dest_default,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_save(local_40,qpdf_log_dest_custom,fn,l,0);
  do_run("{\"inputFile\": \"2pages.pdf\", \"showNpages\": \"\"}",0);
  do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}",3);
  do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}",2);
  do_run("{\"inputFile\": \"attach.pdf\", \"showAttachment\": \"a\"}",0);
  qpdflogger_save_to_standard_output(local_40,1);
  do_run("{\"inputFile\": \"attach.pdf\", \"showAttachment\": \"a\"}",0);
  qpdflogger_cleanup(&local_40);
  return 0;
}

Assistant:

int
main()
{
    FILE* info = do_fopen("info");
    FILE* warn = do_fopen("warn");
    FILE* error = do_fopen("error");
    FILE* save = do_fopen("save");
    FILE* save2 = do_fopen("save2");
    qpdflogger_handle l = qpdflogger_default_logger();

    qpdflogger_set_info(l, qpdf_log_dest_custom, fn, (void*)info);
    qpdflogger_set_warn(l, qpdf_log_dest_custom, fn, (void*)warn);
    qpdflogger_set_error(l, qpdf_log_dest_custom, fn, (void*)error);
    qpdflogger_set_save(l, qpdf_log_dest_custom, fn, (void*)save, 0);

    do_run("{\"inputFile\": \"normal.pdf\", \"showNpages\": \"\"}", qpdf_exit_success);
    do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}", qpdf_exit_warning);
    do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}", qpdf_exit_error);
    do_run(
        "{\"inputFile\": \"normal.pdf\","
        " \"staticId\": \"\","
        " \"streamData\": \"uncompress\","
        " \"outputFile\": \"-\"}",
        qpdf_exit_success);

    fclose(info);
    fclose(warn);
    fclose(error);
    fclose(save);

    qpdflogger_set_info(l, qpdf_log_dest_stderr, NULL, NULL);
    qpdflogger_set_warn(l, qpdf_log_dest_stdout, NULL, NULL);
    qpdflogger_set_error(l, qpdf_log_dest_default, NULL, NULL);
    qpdflogger_set_save(l, qpdf_log_dest_custom, fn, (void*)save2, 0);

    do_run("{\"inputFile\": \"2pages.pdf\", \"showNpages\": \"\"}", qpdf_exit_success);
    do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}", qpdf_exit_warning);
    do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}", qpdf_exit_error);
    do_run(
        "{\"inputFile\": \"attach.pdf\","
        " \"showAttachment\": \"a\"}",
        qpdf_exit_success);

    /* This won't change save since it's already set */
    qpdflogger_save_to_standard_output(l, 1);
    do_run(
        "{\"inputFile\": \"attach.pdf\","
        " \"showAttachment\": \"a\"}",
        qpdf_exit_success);

    qpdflogger_cleanup(&l);

    return 0;
}